

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveFinder.cpp
# Opt level: O1

void __thiscall
senjo::MoveFinder::AddOrigins
          (MoveFinder *this,char pc,int x,int y,
          set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_> *origins)

{
  char (*pacVar1) [8];
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  Square local_3c;
  _Rb_tree<senjo::Square,_senjo::Square,_std::_Identity<senjo::Square>,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>
  *local_38;
  
  pacVar1 = this->board;
  local_38 = &origins->_M_t;
  if ((uint)x < 8) {
    if ((uint)y < 8) {
      if (pacVar1[(uint)x][(uint)y] == pc) {
        local_3c.sqr = 0x78;
        if ((uint)(y | x) < 8) {
          local_3c.sqr = y << 4 | x;
        }
        std::
        _Rb_tree<senjo::Square,_senjo::Square,_std::_Identity<senjo::Square>,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>
        ::_M_insert_unique<senjo::Square>(&origins->_M_t,&local_3c);
      }
    }
    else {
      lVar2 = 0;
      iVar4 = x;
      do {
        if (this->board[(uint)x][lVar2] == pc) {
          local_3c.sqr = 0x78;
          if (((uint)lVar2 | x) < 8) {
            local_3c.sqr = iVar4;
          }
          std::
          _Rb_tree<senjo::Square,_senjo::Square,_std::_Identity<senjo::Square>,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>
          ::_M_insert_unique<senjo::Square>(local_38,&local_3c);
        }
        lVar2 = lVar2 + 1;
        iVar4 = iVar4 + 0x10;
      } while (lVar2 != 8);
    }
  }
  else if ((uint)y < 8) {
    lVar2 = 0;
    do {
      if (this->board[lVar2][(uint)y] == pc) {
        local_3c.sqr = y * 0x10 + (uint)lVar2;
        if (7 < ((uint)lVar2 | y)) {
          local_3c.sqr = 0x78;
        }
        std::
        _Rb_tree<senjo::Square,_senjo::Square,_std::_Identity<senjo::Square>,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>
        ::_M_insert_unique<senjo::Square>(local_38,&local_3c);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
  }
  else {
    uVar5 = 0;
    do {
      uVar3 = uVar5 & 0xffffffff;
      lVar2 = 0;
      do {
        if ((*pacVar1)[lVar2] == pc) {
          local_3c.sqr = 0x78;
          if ((((uint)lVar2 | (uint)uVar5) & 0xfffffff8) == 0) {
            local_3c.sqr = (int)uVar3;
          }
          std::
          _Rb_tree<senjo::Square,_senjo::Square,_std::_Identity<senjo::Square>,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>
          ::_M_insert_unique<senjo::Square>(local_38,&local_3c);
        }
        lVar2 = lVar2 + 1;
        uVar3 = (ulong)((int)uVar3 + 0x10);
      } while (lVar2 != 8);
      uVar5 = uVar5 + 1;
      pacVar1 = pacVar1 + 1;
    } while (uVar5 != 8);
  }
  return;
}

Assistant:

void MoveFinder::AddOrigins(const char pc, int x, int y,
                            std::set<Square>& origins) const
{
  if ((x >= 0) && (x < 8)) {
    if ((y >= 0) && (y < 8)) {
      if (board[x][y] == pc) {
        origins.insert(Square(x, y));
      }
    }
    else {
      for (y = 0; y < 8; ++y) {
        if (board[x][y] == pc) {
          origins.insert(Square(x, y));
        }
      }
    }
  }
  else if ((y >= 0) && (y < 8)) {
    for (x = 0; x < 8; ++x) {
      if (board[x][y] == pc) {
        origins.insert(Square(x, y));
      }
    }
  }
  else {
    for (x = 0; x < 8; ++x) {
      for (y = 0; y < 8; ++y) {
        if (board[x][y] == pc) {
          origins.insert(Square(x, y));
        }
      }
    }
  }
}